

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

size_t utf8_ptr::s_len(char *p,size_t bytecnt)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = p + bytecnt;
  sVar2 = 0;
  while (p < pcVar1) {
    p = s_inc(p);
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

static size_t s_len(const char *p, size_t bytecnt)
    {
        /* get the ending pointer */
        const char *end = p + bytecnt;

        /* increment until we run out of bytes */ 
        size_t cnt;
        for (cnt = 0 ; p < end ; p = s_inc(p), ++cnt) ;

        /* return the result */
        return cnt;
    }